

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

CFGNode * __thiscall
dxil_spv::CFGStructurizer::create_helper_succ_block(CFGStructurizer *this,CFGNode *node)

{
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_40;
  CFGNode *local_20;
  CFGNode *succ_node;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  succ_node = node;
  node_local = (CFGNode *)this;
  local_20 = CFGNodePool::create_node(this->pool);
  std::operator+(&local_40,&succ_node->name,".succ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&local_20->name,&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string(&local_40);
  local_20->forward_post_visit_order = succ_node->forward_post_visit_order;
  local_20->backward_post_visit_order = succ_node->backward_post_visit_order;
  std::swap<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
            (&local_20->succ,&succ_node->succ);
  local_20->immediate_post_dominator = succ_node->immediate_post_dominator;
  succ_node->immediate_post_dominator = local_20;
  Terminator::operator=(&(local_20->ir).terminator,&(succ_node->ir).terminator);
  (succ_node->ir).terminator.type = Branch;
  (succ_node->ir).terminator.direct_block = local_20;
  if ((local_20->ir).terminator.type == Condition) {
    (local_20->ir).merge_info.selection_control_mask =
         (succ_node->ir).merge_info.selection_control_mask;
  }
  retarget_succ_from(this,local_20,succ_node);
  CFGNode::add_branch(succ_node,local_20);
  return local_20;
}

Assistant:

CFGNode *CFGStructurizer::create_helper_succ_block(CFGNode *node)
{
	auto *succ_node = pool.create_node();
	succ_node->name = node->name + ".succ";

	// Fixup visit order later.
	succ_node->forward_post_visit_order = node->forward_post_visit_order;
	succ_node->backward_post_visit_order = node->backward_post_visit_order;

	std::swap(succ_node->succ, node->succ);
	// Do not swap back edges, only forward edges.

	succ_node->immediate_post_dominator = node->immediate_post_dominator;
	node->immediate_post_dominator = succ_node;

	succ_node->ir.terminator = node->ir.terminator;
	node->ir.terminator.type = Terminator::Type::Branch;
	node->ir.terminator.direct_block = succ_node;

	// Inherit selection construct from parent since we're taking over any selection.
	if (succ_node->ir.terminator.type == Terminator::Type::Condition)
		succ_node->ir.merge_info.selection_control_mask = node->ir.merge_info.selection_control_mask;

	retarget_succ_from(succ_node, node);

	node->add_branch(succ_node);
	return succ_node;
}